

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O1

void __thiscall wabt::interp::Istream::EmitInternal<unsigned_char>(Istream *this,uchar val)

{
  ulong __new_size;
  ulong uVar1;
  
  uVar1 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  __new_size = (ulong)((int)uVar1 + 1);
  if (uVar1 < __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,__new_size);
  }
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[uVar1 & 0xffffffff] = val;
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}